

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

bool __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::deep_equal
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *other)

{
  long lVar1;
  bool bVar2;
  
  if (other == (rt_expression_interface<double> *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = __dynamic_cast(other,&rt_expression_interface<double>::typeinfo,
                           &rt_variable<viennamath::rt_expression_interface<double>>::typeinfo,0);
  }
  if (lVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(id_type *)(lVar1 + 8) == this->id_;
  }
  return bVar2;
}

Assistant:

bool deep_equal(const InterfaceType * other) const
      {
        const self_type * ptr = dynamic_cast< const self_type *>(other);
        if (ptr != NULL)
          return ptr->id() == id_;

        return false;
      }